

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int socket_set(nng_socket s,char *name,void *val,size_t sz,nni_type t)

{
  int iVar1;
  nni_sock *in_RAX;
  nni_sock *local_38;
  nni_sock *sock;
  
  local_38 = in_RAX;
  iVar1 = nni_sock_find(&local_38,s.id);
  if (iVar1 == 0) {
    iVar1 = nni_sock_setopt(local_38,name,val,sz,t);
    nni_sock_rele(local_38);
  }
  return iVar1;
}

Assistant:

static int
socket_set(
    nng_socket s, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_sock *sock;
	int       rv;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	rv = nni_sock_setopt(sock, name, val, sz, t);
	nni_sock_rele(sock);
	return (rv);
}